

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O0

char * waterbody_name(xchar x,xchar y)

{
  char cVar1;
  boolean bVar2;
  schar ltyp;
  rm *loc;
  xchar y_local;
  xchar x_local;
  
  if ((((x < '\x01') || ('O' < x)) || (y < '\0')) || ('\x14' < y)) {
    return "drink";
  }
  cVar1 = level->locations[x][y].typ;
  bVar2 = is_lava(level,(int)x,(int)y);
  if (bVar2 != '\0') {
    return "lava";
  }
  if ((cVar1 == '\"') ||
     ((cVar1 == '\x14' && ((*(uint *)&level->locations[x][y].field_0x6 >> 4 & 0x1c) == 8)))) {
    return "ice";
  }
  if ((((cVar1 != '\x11') && (cVar1 != '\x13')) &&
      ((cVar1 != '#' &&
       (((bVar2 = on_level(&u.uz,&dungeon_topology.d_medusa_level), bVar2 == '\0' &&
         (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 == '\0')) &&
        (bVar2 = on_level(&u.uz,&dungeon_topology.d_juiblex_level), bVar2 == '\0')))))) ||
     ((cVar1 == '\x14' && ((*(uint *)&level->locations[x][y].field_0x6 >> 4 & 0x1c) == 0)))) {
    return "moat";
  }
  if (((cVar1 == '\x11') ||
      ((cVar1 == '\x13' ||
       (bVar2 = on_level(&u.uz,&dungeon_topology.d_juiblex_level), bVar2 == '\0')))) &&
     (cVar1 != '#')) {
    if (cVar1 == '\x11') {
      return "pool of water";
    }
    return "water";
  }
  return "swamp";
}

Assistant:

const char *waterbody_name(xchar x, xchar y)
{
	struct rm *loc;
	schar ltyp;

	if (!isok(x,y))
		return "drink";		/* should never happen */
	loc = &level->locations[x][y];
	ltyp = loc->typ;

	if (is_lava(level, x,y))
		return "lava";
	else if (ltyp == ICE ||
		 (ltyp == DRAWBRIDGE_UP &&
		  (level->locations[x][y].drawbridgemask & DB_UNDER) == DB_ICE))
		return "ice";
	else if ((ltyp != POOL && ltyp != WATER && ltyp != BOG &&
	  !Is_medusa_level(&u.uz) && !Is_waterlevel(&u.uz) && !Is_juiblex_level(&u.uz)) ||
	   (ltyp == DRAWBRIDGE_UP && (level->locations[x][y].drawbridgemask & DB_UNDER) == DB_MOAT))
		return "moat";
	else if ((ltyp != POOL && ltyp != WATER && Is_juiblex_level(&u.uz)) ||
		 ltyp == BOG)
		return "swamp";
	else if (ltyp == POOL)
		return "pool of water";
	else return "water";
}